

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O1

void mjs::anon_unknown_33::define_own_property_checked
               (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *p,value *desc)

{
  property_attribute pVar1;
  property_attribute attributes;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  value *v;
  long *plVar6;
  uint *puVar7;
  undefined8 *puVar8;
  object *poVar9;
  void *pvVar10;
  undefined4 *puVar11;
  wostream *pwVar12;
  native_error_exception *pnVar13;
  global_object *pgVar14;
  wchar_t *pwVar15;
  undefined1 *puVar16;
  wchar_t *pwVar17;
  wstring_view p_00;
  wstring_view p_01;
  wstring_view p_02;
  wstring_view p_03;
  wstring_view p_04;
  wstring_view p_05;
  wstring_view p_06;
  wstring_view p_07;
  wstring_view p_08;
  wstring_view name;
  property_attribute current_attributes;
  object_ptr temp;
  property_attribute a;
  value set;
  value s;
  anon_class_24_3_a4a98722 apply_flag;
  anon_class_16_2_d5e5c5aa check_accessor;
  wostringstream woss;
  property_attribute local_324;
  undefined1 local_320 [16];
  undefined1 local_310 [28];
  property_attribute local_2f4;
  undefined1 local_2f0 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_2e8;
  undefined1 local_2c8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_2c0;
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  undefined1 local_250 [40];
  anon_class_24_3_a4a98722 local_228;
  undefined1 local_208 [40];
  value local_1e0;
  wstring_view local_1b8;
  undefined1 local_1a8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_1a0 [11];
  
  local_310._16_8_ = global;
  v = (value *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::validate_object((global_object *)local_320,v);
  plVar6 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
  local_1a0[0]._0_8_ = puVar7 + 1;
  local_1a8 = (undefined1  [8])(ulong)*puVar7;
  local_324 = (**(code **)(*plVar6 + 0x30))(plVar6);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
  local_2f0 = (undefined1  [8])0x8;
  local_2e8.n_ = 8.39204095925274e-318;
  (**(code **)*puVar8)(local_1a8,puVar8);
  bVar2 = to_boolean((value *)local_1a8);
  value::destroy((value *)local_1a8);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
  local_2f0 = (undefined1  [8])0xa;
  local_2e8.n_ = 8.39221882288525e-318;
  (**(code **)*puVar8)(local_1a8,puVar8);
  bVar3 = to_boolean((value *)local_1a8);
  value::destroy((value *)local_1a8);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
  local_2f0 = (undefined1  [8])0xc;
  local_2e8.n_ = 8.39243621176942e-318;
  (**(code **)*puVar8)(local_1a8,puVar8);
  bVar4 = to_boolean((value *)local_1a8);
  value::destroy((value *)local_1a8);
  pVar1 = !bVar2 + dont_enum;
  if (bVar3) {
    pVar1 = (uint)!bVar2;
  }
  attributes = pVar1 + dont_delete;
  if (bVar4) {
    attributes = pVar1;
  }
  poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
  local_1a8 = (undefined1  [8])0x3;
  local_1a0[0].n_ = L"get";
  bVar2 = object::has_property(poVar9,(wstring_view *)local_1a8);
  if (bVar2) {
LAB_00155965:
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
    local_250._0_8_ = 5;
    pwVar15 = L"value";
    local_250._8_8_ = L"value";
    bVar2 = object::has_property(poVar9,(wstring_view *)local_250);
    if (bVar2) {
LAB_00156419:
      pnVar13 = (native_error_exception *)__cxa_allocate_exception(0x58);
      pgVar14 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310._16_8_);
      global_object::stack_trace_abi_cxx11_((wstring *)local_1a8,pgVar14);
      local_2f0 = (undefined1  [8])local_1a0[0]._0_8_;
      local_2e8.n_ = (double)local_1a8;
      local_250._0_8_ = 0x46;
      local_250._8_8_ = "Accessor property descriptor may not have value or writable attributes";
      native_error_exception::native_error_exception
                (pnVar13,type,(wstring_view *)local_2f0,(string_view *)local_250);
      __cxa_throw(pnVar13,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
    local_208._0_8_ = 8;
    local_208._8_8_ = L"writable";
    bVar2 = object::has_property(poVar9,(wstring_view *)local_208);
    if (bVar2) goto LAB_00156419;
  }
  else {
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
    local_2f0 = (undefined1  [8])0x3;
    pwVar15 = L"set";
    local_2e8.n_ = 8.37113210112074e-318;
    bVar2 = object::has_property(poVar9,(wstring_view *)local_2f0);
    if (bVar2) goto LAB_00155965;
  }
  if (invalid < local_324) {
    __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                  ,0x24,"bool mjs::is_valid(property_attribute)");
  }
  if (local_324 == invalid) {
    pvVar10 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    bVar5 = 2;
    if (*(char *)((long)pvVar10 + 0x1c) != '\x01') goto LAB_00155e2c;
    bVar2 = is_accessor_descriptor((object_ptr *)local_320);
    if (((!bVar2) && (bVar2 = is_data_descriptor((object_ptr *)local_320), !bVar2)) ||
       (bVar2 = is_data_descriptor((object_ptr *)local_320), bVar2)) {
      plVar6 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
      local_2f0 = (undefined1  [8])0x5;
      local_2e8.n_ = 8.39192238349774e-318;
      (**(code **)*puVar8)(local_1a8,puVar8);
      (**(code **)(*plVar6 + 8))(plVar6,p,local_1a8,attributes);
      value::destroy((value *)local_1a8);
    }
    else {
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
      local_2f0 = (undefined1  [8])0x3;
      local_2e8.n_ = 8.37105305061741e-318;
      (**(code **)*puVar8)(local_1a8,puVar8);
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
      local_250._0_8_ = 3;
      local_250._8_8_ = L"set";
      (**(code **)*puVar8)(local_2f0,puVar8);
      if (local_2f0._0_4_ == 0 && local_1a8._0_4_ == undefined) {
        __assert_fail("get.type() != value_type::undefined || set.type() != value_type::undefined",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                      ,0x6e,
                      "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                     );
      }
      local_1e0.field_1.n_ = (double)local_310._16_8_;
      local_1e0._0_8_ = p;
      value::value((value *)local_250,(value *)local_1a8);
      define_own_property::anon_class_16_2_d5e5c5aa::operator()
                ((anon_class_16_2_d5e5c5aa *)&local_1e0,"Getter",(value *)local_250);
      value::destroy((value *)local_250);
      value::value((value *)local_208,(value *)local_2f0);
      define_own_property::anon_class_16_2_d5e5c5aa::operator()
                ((anon_class_16_2_d5e5c5aa *)&local_1e0,"Setter",(value *)local_208);
      value::destroy((value *)local_208);
      define_accessor_property
                ((gc_heap_ptr<mjs::global_object> *)local_310._16_8_,o,p,(value *)local_1a8,
                 (value *)local_2f0,attributes);
      value::destroy((value *)local_2f0);
      value::destroy((value *)local_1a8);
    }
  }
  else {
    p_00._M_str = pwVar15;
    p_00._M_len = (size_t)L"writable";
    bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0x8,p_00);
    if ((((bVar2) ||
         (p_01._M_str = pwVar15, p_01._M_len = (size_t)L"enumerable",
         bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0xa,p_01), bVar2)) ||
        (p_02._M_str = pwVar15, p_02._M_len = (size_t)L"configurable",
        bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0xc,p_02), bVar2)) ||
       (((p_03._M_str = pwVar15, p_03._M_len = (size_t)L"value",
         bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0x5,p_03), bVar2 ||
         (p_04._M_str = pwVar15, p_04._M_len = (size_t)L"get",
         bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0x3,p_04), bVar2)) ||
        (p_05._M_str = pwVar15, p_05._M_len = (size_t)L"set",
        bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0x3,p_05), bVar2)))) {
      if (local_324 == attributes) {
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
        local_1a0[0]._0_8_ = puVar7 + 1;
        local_1a8 = (undefined1  [8])(ulong)*puVar7;
        (**(code **)*puVar8)(local_2f0,puVar8);
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
        local_208._0_8_ = 5;
        local_208._8_8_ = L"value";
        pwVar15 = (wchar_t *)*puVar8;
        (**(code **)pwVar15)(local_250,puVar8);
        bVar2 = operator==((value *)local_2f0,(value *)local_250);
        value::destroy((value *)local_250);
        value::destroy((value *)local_2f0);
      }
      else {
        bVar2 = false;
      }
      if (bVar2 == false) {
        bVar2 = has_attributes(local_324,dont_delete);
        if (bVar2) {
          bVar2 = has_attributes(attributes,dont_delete);
          bVar5 = 1;
          if (!bVar2) goto LAB_00155e2c;
          p_06._M_str = pwVar15;
          p_06._M_len = (size_t)L"enumerable";
          bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0xa,p_06);
          if (bVar2) {
            bVar2 = has_attributes(local_324,dont_enum);
            bVar3 = has_attributes(attributes,dont_enum);
            if (bVar2 != bVar3) goto LAB_00155e2c;
          }
        }
        bVar2 = is_accessor_descriptor((object_ptr *)local_320);
        if ((bVar2) || (bVar2 = is_data_descriptor((object_ptr *)local_320), bVar2)) {
          bVar2 = has_attributes(local_324,accessor);
          bVar3 = is_data_descriptor((object_ptr *)local_320);
          if (bVar2 == bVar3) {
            bVar2 = has_attributes(local_324,dont_delete);
            bVar5 = 1;
            if (bVar2) goto LAB_00155e2c;
          }
          else {
            bVar2 = has_attributes(local_324,accessor);
            if (bVar2) {
              bVar2 = has_attributes(local_324,accessor);
              if ((!bVar2) || (bVar2 = is_accessor_descriptor((object_ptr *)local_320), !bVar2)) {
                __assert_fail("has_attributes(current_attributes, property_attribute::accessor) && is_accessor_descriptor(desc)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                              ,0xae,
                              "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                             );
              }
            }
            else {
              bVar2 = has_attributes(local_324,dont_delete);
              if ((bVar2) && (bVar2 = has_attributes(local_324,read_only), bVar2)) {
                bVar5 = 1;
                bVar2 = has_attributes(attributes,read_only);
                if (!bVar2) goto LAB_00155e2c;
                p_07._M_str = pwVar15;
                p_07._M_len = (size_t)L"value";
                bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0x5,p_07);
                if (bVar2) {
                  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
                  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
                  local_1a0[0]._0_8_ = puVar7 + 1;
                  local_1a8 = (undefined1  [8])(ulong)*puVar7;
                  (**(code **)*puVar8)(local_208,puVar8);
                  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
                  local_2c8._0_4_ = 5;
                  local_2c8[4] = false;
                  local_2c8._5_3_ = 0;
                  local_2c0.n_ = 8.39192238349774e-318;
                  pwVar15 = (wchar_t *)*puVar8;
                  (**(code **)pwVar15)(&local_1e0,puVar8);
                  bVar2 = operator==((value *)local_208,&local_1e0);
                  bVar2 = !bVar2;
                  value::destroy(&local_1e0);
                  value::destroy((value *)local_208);
                }
                else {
                  bVar2 = false;
                }
                if (bVar2) goto LAB_00155e2c;
              }
            }
          }
        }
        local_228.a = &local_2f4;
        local_2f4 = none;
        local_228.current_attributes = &local_324;
        local_228.desc = (object_ptr *)local_320;
        define_own_property::anon_class_24_3_a4a98722::operator()
                  (&local_228,L"enumerable",dont_enum);
        define_own_property::anon_class_24_3_a4a98722::operator()
                  (&local_228,L"configurable",dont_delete);
        bVar2 = is_accessor_descriptor((object_ptr *)local_320);
        if ((!bVar2) &&
           (((bVar2 = is_accessor_descriptor((object_ptr *)local_320), bVar2 ||
             (bVar2 = is_data_descriptor((object_ptr *)local_320), bVar2)) ||
            (bVar2 = has_attributes(local_324,accessor), !bVar2)))) {
          define_own_property::anon_class_24_3_a4a98722::operator()
                    (&local_228,L"writable",read_only);
          plVar6 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
          pwVar17 = L"value";
          p_08._M_str = pwVar15;
          p_08._M_len = (size_t)L"value";
          bVar2 = has_own_property((anon_unknown_33 *)local_320,(object_ptr *)0x5,p_08);
          if (bVar2) {
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
            puVar16 = local_2c8;
            local_2c8._0_4_ = 5;
            local_2c8[4] = false;
            local_2c8._5_3_ = 0;
          }
          else {
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
            puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
            pwVar17 = (wchar_t *)(puVar7 + 1);
            local_2a0._0_8_ = ZEXT48(*puVar7);
            puVar16 = local_2a0;
          }
          *(wchar_t **)(puVar16 + 8) = pwVar17;
          (**(code **)*puVar8)(local_1a8,puVar8);
          bVar5 = (**(code **)(*plVar6 + 0x28))(plVar6,p,local_1a8,local_2f4);
          value::destroy((value *)local_1a8);
          bVar5 = bVar5 ^ 1;
          goto LAB_00155e2c;
        }
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
        local_2c8._0_4_ = 3;
        local_2c8[4] = false;
        local_2c8._5_3_ = 0;
        local_2c0.n_ = 8.37105305061741e-318;
        (**(code **)*puVar8)(local_1a8,puVar8);
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
        local_2a0._0_8_ = 3;
        local_2a0._8_8_ = L"set";
        (**(code **)*puVar8)(local_2c8,puVar8);
        bVar2 = has_attributes(local_324,accessor);
        if (bVar2) {
          pvVar10 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
          puVar11 = (undefined4 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
          name._M_str._0_4_ = *puVar11;
          name._M_len = (size_t)pvVar10;
          name._M_str._4_4_ = 0;
          object::get_accessor_property_object((object *)local_310,name);
          poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_320);
          local_2a0._0_8_ = 3;
          local_2a0._8_8_ = L"get";
          bVar2 = object::has_property(poVar9,(wstring_view *)local_2a0);
          if (!bVar2) {
            poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310);
            local_2a0._0_8_ = 3;
            local_2a0._8_8_ = L"get";
            bVar2 = object::has_property(poVar9,(wstring_view *)local_2a0);
            if (bVar2) {
              puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310);
              local_278._0_8_ = 3;
              local_278._8_8_ = L"get";
              (**(code **)*puVar8)(local_2a0,puVar8);
              value::operator=((value *)local_1a8,(value *)local_2a0);
              value::destroy((value *)local_2a0);
            }
LAB_001562c4:
            if (local_2c8._0_4_ == 0) {
              poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310);
              local_278._0_8_ = 3;
              local_278._8_8_ = L"set";
              bVar2 = object::has_property(poVar9,(wstring_view *)local_278);
              if (bVar2) {
                puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310);
                local_1b8._M_len = 3;
                local_1b8._M_str = L"set";
                (**(code **)*puVar8)(local_278,puVar8);
                value::operator=((value *)local_2c8,(value *)local_278);
                value::destroy((value *)local_278);
              }
            }
            else {
              bVar2 = has_attributes(local_324,read_only);
              if (bVar2) {
                puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310);
                local_1b8._M_len = 3;
                local_1b8._M_str = L"set";
                (**(code **)*puVar8)(local_278,puVar8);
                bVar2 = operator==((value *)local_2c8,(value *)local_278);
                bVar2 = !bVar2;
                value::destroy((value *)local_278);
              }
              else {
                bVar2 = false;
              }
              if (bVar2) goto LAB_001563bc;
            }
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_310);
            goto LAB_001563d8;
          }
          bVar2 = has_attributes(local_324,read_only);
          if (bVar2) {
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310);
            local_278._0_8_ = 3;
            local_278._8_8_ = L"get";
            (**(code **)*puVar8)(local_2a0,puVar8);
            bVar2 = operator==((value *)local_1a8,(value *)local_2a0);
            bVar2 = !bVar2;
            value::destroy((value *)local_2a0);
          }
          else {
            bVar2 = false;
          }
          if (!bVar2) goto LAB_001562c4;
LAB_001563bc:
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_310);
          bVar5 = 1;
        }
        else {
LAB_001563d8:
          bVar5 = 0;
          define_accessor_property
                    ((gc_heap_ptr<mjs::global_object> *)local_310._16_8_,o,p,(value *)local_1a8,
                     (value *)local_2c8,local_2f4);
        }
        value::destroy((value *)local_2c8);
        value::destroy((value *)local_1a8);
        goto LAB_00155e2c;
      }
    }
  }
  bVar5 = 0;
LAB_00155e2c:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_320);
  if (bVar5 == 0) {
    return;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
  if (bVar5 == 2) {
    pwVar12 = std::operator<<((wostream *)local_1a8,"cannot define property: ");
    puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
    pwVar12 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                        (pwVar12,(wchar_t *)(puVar7 + 1),(ulong)*puVar7);
    std::operator<<(pwVar12,", object is not extensible");
  }
  else {
    if (bVar5 != 1) {
      __assert_fail("res == define_own_property_result::not_extensible",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                    ,0xea,
                    "void mjs::(anonymous namespace)::define_own_property_checked(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const value &)"
                   );
    }
    pwVar12 = std::operator<<((wostream *)local_1a8,"cannot redefine property: ");
    puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)p);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              (pwVar12,(wchar_t *)(puVar7 + 1),(ulong)*puVar7);
  }
  pnVar13 = (native_error_exception *)__cxa_allocate_exception(0x58);
  pgVar14 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_310._16_8_);
  global_object::stack_trace_abi_cxx11_((wstring *)local_2c8,pgVar14);
  local_310._0_8_ = local_2c0.n_;
  local_310._8_8_ = local_2c8;
  std::__cxx11::wstringbuf::str();
  local_1b8._M_len = (size_t)local_228.a;
  local_1b8._M_str = (wchar_t *)local_228.desc;
  native_error_exception::native_error_exception(pnVar13,type,(wstring_view *)local_310,&local_1b8);
  __cxa_throw(pnVar13,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void define_own_property_checked(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& p, const value& desc) {
    const auto res = define_own_property(global, o, p, global->validate_object(desc));
    if (res == define_own_property_result::ok) {
        return;
    }

    std::wostringstream woss;
    if (res == define_own_property_result::cannot_redefine) {
        woss << "cannot redefine property: " << p.view();
    } else {
        assert(res == define_own_property_result::not_extensible);
        woss << "cannot define property: " << p.view() << ", object is not extensible";
    }
    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
}